

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O1

void DepParserTask::run(search *sch,multi_ex *ec)

{
  v_array<unsigned_int> *valid_action;
  v_array<std::pair<unsigned_int,_float>_> *gold_action_losses;
  v_array<unsigned_int> *gold_actions;
  int iVar1;
  uint uVar2;
  undefined8 *puVar3;
  uint n;
  bool bVar4;
  ptag pVar5;
  action aVar6;
  uint32_t t_id;
  action aVar7;
  ptag count;
  predictor *ppVar8;
  stringstream *psVar9;
  ostream *poVar10;
  vw_exception *this;
  size_t i;
  long lVar11;
  ulong uVar12;
  uint32_t uVar13;
  uint64_t stack_depth;
  uint64_t state;
  uint idx;
  uint32_t right_label;
  uint32_t left_label;
  size_t sVar14;
  ulong uVar15;
  ptag tag;
  ulong uVar16;
  float loss;
  predictor P;
  stringstream __msg;
  string local_2c0;
  predictor local_2a0;
  pair<unsigned_int,_float> local_1b8 [2];
  ostream local_1a8;
  
  puVar3 = (undefined8 *)sch->task_data;
  uVar16 = (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  v_array<unsigned_int>::clear((v_array<unsigned_int> *)(puVar3 + 0x13));
  local_1b8[0].first = 1;
  if (puVar3[1] == 0) {
    local_1b8[0].first = (uint)(*(int *)((long)puVar3 + 0x2c4) != 1);
  }
  valid_action = (v_array<unsigned_int> *)(puVar3 + 3);
  gold_action_losses = (v_array<std::pair<unsigned_int,_float>_> *)(puVar3 + 0x2f);
  gold_actions = (v_array<unsigned_int> *)(puVar3 + 0x27);
  v_array<unsigned_int>::push_back((v_array<unsigned_int> *)(puVar3 + 0x13),&local_1b8[0].first);
  n = (uint)uVar16;
  lVar11 = 0;
  do {
    if ((ulong)(n + 1) != 0) {
      uVar12 = 0;
      do {
        *(undefined4 *)(puVar3[lVar11 * 4 + 0x33] + uVar12 * 4) = 0;
        uVar12 = uVar12 + 1;
      } while (n + 1 != uVar12);
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 6);
  uVar16 = uVar16 & 0xffffffff;
  if (uVar16 != 0) {
    uVar12 = 0;
    do {
      *(undefined4 *)(puVar3[0x17] + 4 + uVar12 * 4) = 9999999;
      *(undefined4 *)(puVar3[0x1b] + 4 + uVar12 * 4) = 9999999;
      uVar12 = uVar12 + 1;
    } while (uVar16 != uVar12);
  }
  sVar14 = 2;
  if (puVar3[1] == 0) {
    sVar14 = (size_t)((*(int *)((long)puVar3 + 0x2c4) != 1) + 1);
  }
  Search::predictor::predictor(&local_2a0,sch,0);
  tag = 1;
LAB_0025edcf:
  do {
    uVar12 = sVar14 & 0xffffffff;
    do {
      iVar1 = *(int *)((long)puVar3 + 0x2c4);
      idx = (uint)sVar14;
      if ((((iVar1 == 1) && ((ulong)(puVar3[0x14] - puVar3[0x13]) < 5)) && (n < idx)) ||
         (((iVar1 == 2 && (puVar3[0x14] == puVar3[0x13])) && (n < idx)))) {
        if (iVar1 == 1) {
          *(undefined4 *)(puVar3[0x17] + (ulong)*(uint *)(puVar3[0x14] + -4) * 4) = 0;
          *(undefined4 *)(puVar3[0x1b] + (ulong)*(uint *)(puVar3[0x14] + -4) * 4) =
               *(undefined4 *)(puVar3 + 1);
          if (*(int *)(puVar3[0xb] + (ulong)*(uint *)(puVar3[0x14] + -4) * 4) ==
              *(int *)(puVar3[0x17] + (ulong)*(uint *)(puVar3[0x14] + -4) * 4)) {
            loss = 0.0;
          }
          else {
            loss = 1.0;
          }
          Search::search::loss(sch,loss);
        }
        psVar9 = Search::search::output_abi_cxx11_(sch);
        if ((*(int *)(psVar9 + *(long *)(*(long *)psVar9 + -0x18) + 0x20) == 0) && (uVar16 != 0)) {
          uVar12 = 0;
          do {
            psVar9 = Search::search::output_abi_cxx11_(sch);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)(psVar9 + 0x10));
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,":",1);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            uVar12 = uVar12 + 1;
          } while (uVar16 != uVar12);
        }
        Search::predictor::~predictor(&local_2a0);
        return;
      }
      bVar4 = Search::search::predictNeedsExample(sch);
      if (bVar4) {
        extract_features(sch,idx,ec);
      }
      lVar11 = puVar3[0x14] - puVar3[0x13];
      if (lVar11 == 0) {
        state = 0;
      }
      else {
        state = (uint64_t)*(uint *)(puVar3[0x14] + -4);
      }
      stack_depth = lVar11 >> 2;
      get_valid_actions(sch,valid_action,uVar12,uVar16,stack_depth,state);
      if (*(int *)((long)puVar3 + 0x2c4) == 2) {
        get_eager_action_cost(sch,idx,uVar16);
      }
      else if (*(int *)((long)puVar3 + 0x2c4) == 1) {
        get_hybrid_action_cost(sch,uVar12,uVar16);
      }
      uVar13 = (uint32_t)stack_depth;
      lVar11 = puVar3[0x14];
      if (puVar3[0x13] == lVar11) {
        left_label = 9999999;
      }
      else {
        left_label = *(uint32_t *)(puVar3[0xf] + (ulong)*(uint *)(lVar11 + -4) * 4);
      }
      uVar2 = *(uint *)((long)puVar3 + 0x2c4);
      if (uVar2 == 2) {
        if (n < idx) {
          right_label = *(uint32_t *)(puVar3 + 1);
        }
        else {
          right_label = *(uint32_t *)(puVar3[0xf] + uVar12 * 4);
        }
      }
      else {
        if (uVar2 != 1) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&local_1a8,"unknown transition system",0x19);
          this = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search_dep_parser.cc"
                     ,0x285,&local_2c0);
          __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        if (puVar3[0x13] == lVar11) {
          right_label = 9999999;
        }
        else {
          right_label = *(uint32_t *)(puVar3[0xf] + (ulong)*(uint *)(lVar11 + -4) * 4);
        }
      }
      if (*(char *)((long)puVar3 + 0x2c2) == '\x01') {
        if (*(char *)((long)puVar3 + 0x2c1) == '\0') {
          get_gold_actions(sch,idx,(ulong)uVar2,gold_actions);
          convert_to_onelearner_actions
                    (sch,gold_actions,(v_array<unsigned_int> *)(puVar3 + 0x2b),left_label,
                     right_label);
          uVar13 = 9999999;
          convert_to_onelearner_actions
                    (sch,valid_action,(v_array<unsigned_int> *)(puVar3 + 0x23),9999999,9999999);
          ppVar8 = Search::predictor::set_tag(&local_2a0,tag);
          ppVar8 = Search::predictor::set_input(ppVar8,(example *)*puVar3);
          ppVar8 = Search::predictor::set_oracle(ppVar8,(v_array<unsigned_int> *)(puVar3 + 0x2b));
          ppVar8 = Search::predictor::set_allowed(ppVar8,(v_array<unsigned_int> *)(puVar3 + 0x23));
          pVar5 = Search::search::get_history_length(sch);
        }
        else {
          get_cost_to_go_losses(sch,gold_action_losses,left_label,right_label);
          ppVar8 = Search::predictor::set_tag(&local_2a0,tag);
          ppVar8 = Search::predictor::set_input(ppVar8,(example *)*puVar3);
          ppVar8 = Search::predictor::set_allowed(ppVar8,gold_action_losses);
          pVar5 = Search::search::get_history_length(sch);
        }
        ppVar8 = Search::predictor::set_condition_range(ppVar8,tag - 1,pVar5,'p');
        ppVar8 = Search::predictor::set_learner_id(ppVar8,0);
        aVar6 = Search::predictor::predict(ppVar8);
        t_id = 0;
        aVar7 = 1;
        pVar5 = tag;
        if (aVar6 != 1) {
          uVar2 = *(uint *)(puVar3 + 2);
          aVar7 = 4;
          if (aVar6 != uVar2 * 2 + 2) {
            t_id = aVar6 - 1;
            aVar7 = 2;
            if (!(bool)(~(aVar6 == 0) & t_id <= uVar2)) {
              t_id = aVar6 + ~uVar2;
              aVar7 = 3;
            }
          }
        }
      }
      else {
        if (*(char *)((long)puVar3 + 0x2c1) == '\0') {
          get_gold_actions(sch,idx,(ulong)uVar2,gold_actions);
          ppVar8 = Search::predictor::set_tag(&local_2a0,tag);
          ppVar8 = Search::predictor::set_input(ppVar8,(example *)*puVar3);
          ppVar8 = Search::predictor::set_oracle(ppVar8,gold_actions);
          ppVar8 = Search::predictor::set_allowed(ppVar8,valid_action);
          pVar5 = Search::search::get_history_length(sch);
        }
        else {
          get_cost_to_go_losses(sch,gold_action_losses,left_label,right_label);
          ppVar8 = Search::predictor::set_tag(&local_2a0,tag);
          ppVar8 = Search::predictor::set_input(ppVar8,(example *)*puVar3);
          ppVar8 = Search::predictor::set_allowed(ppVar8,gold_action_losses);
          pVar5 = Search::search::get_history_length(sch);
        }
        ppVar8 = Search::predictor::set_condition_range(ppVar8,tag - 1,pVar5,'p');
        ppVar8 = Search::predictor::set_learner_id(ppVar8,0);
        aVar7 = Search::predictor::predict(ppVar8);
        uVar13 = (uint32_t)stack_depth;
        pVar5 = tag + 1;
        t_id = 0;
        if ((aVar7 != 1) && (aVar7 != 4)) {
          if ((!bVar4) && (bVar4 = Search::search::predictNeedsExample(sch), bVar4)) {
            extract_features(sch,idx,ec);
          }
          uVar13 = (uint32_t)stack_depth;
          if (*(char *)((long)puVar3 + 0x2c1) == '\x01') {
            v_array<std::pair<unsigned_int,_float>_>::clear(gold_action_losses);
            uVar13 = (uint32_t)stack_depth;
            if (*(int *)(puVar3 + 2) != 0) {
              if (aVar7 == 3) {
                right_label = left_label;
              }
              uVar15 = 1;
              do {
                local_1b8[0].first = (uint)uVar15;
                local_1b8[0].second = 1.0;
                if (right_label == uVar15) {
                  local_1b8[0].second = 0.0;
                }
                v_array<std::pair<unsigned_int,_float>_>::push_back(gold_action_losses,local_1b8);
                uVar13 = (uint32_t)stack_depth;
                bVar4 = uVar15 < *(uint *)(puVar3 + 2);
                uVar15 = uVar15 + 1;
              } while (bVar4);
            }
            ppVar8 = Search::predictor::set_tag(&local_2a0,pVar5);
            ppVar8 = Search::predictor::set_input(ppVar8,(example *)*puVar3);
            ppVar8 = Search::predictor::set_allowed(ppVar8,gold_action_losses);
            count = Search::search::get_history_length(sch);
          }
          else {
            ppVar8 = Search::predictor::set_tag(&local_2a0,pVar5);
            ppVar8 = Search::predictor::set_input(ppVar8,(example *)*puVar3);
            if (aVar7 == 3) {
              right_label = left_label;
            }
            ppVar8 = Search::predictor::set_oracle(ppVar8,right_label);
            ppVar8 = Search::predictor::erase_alloweds(ppVar8);
            count = Search::search::get_history_length(sch);
          }
          ppVar8 = Search::predictor::set_condition_range(ppVar8,tag,count,'p');
          ppVar8 = Search::predictor::set_learner_id(ppVar8,(ulong)(aVar7 - 1));
          t_id = Search::predictor::predict(ppVar8);
        }
      }
      tag = pVar5 + 1;
      if (*(int *)((long)puVar3 + 0x2c4) == 2) {
        sVar14 = transition_eager(sch,(ulong)aVar7,idx,t_id,n);
        goto LAB_0025edcf;
      }
    } while (*(int *)((long)puVar3 + 0x2c4) != 1);
    sVar14 = transition_hybrid(sch,(ulong)aVar7,idx,t_id,uVar13);
  } while( true );
}

Assistant:

void run(Search::search &sch, multi_ex &ec)
{
  task_data *data = sch.get_task_data<task_data>();
  v_array<uint32_t> &stack = data->stack, &gold_heads = data->gold_heads, &valid_actions = data->valid_actions,
                    &heads = data->heads, &gold_tags = data->gold_tags, &tags = data->tags,
                    &valid_action_temp = data->valid_action_temp;
  v_array<uint32_t> &gold_action_temp = data->gold_action_temp;
  v_array<pair<action, float>> &gold_action_losses = data->gold_action_losses;
  v_array<action> &gold_actions = data->gold_actions;
  bool &cost_to_go = data->cost_to_go, &one_learner = data->one_learner;
  uint32_t &num_label = data->num_label;
  uint32_t &sys = data->transition_system;
  uint32_t n = (uint32_t)ec.size();
  uint32_t left_label, right_label;
  stack.clear();
  stack.push_back((data->root_label == 0 && sys == arc_hybrid) ? 0 : 1);
  for (size_t i = 0; i < 6; i++)
    for (size_t j = 0; j < n + 1; j++) data->children[i][j] = 0;
  for (size_t i = 0; i < n; i++)
  {
    heads[i + 1] = my_null;
    tags[i + 1] = my_null;
  }
  ptag count = 1;
  uint32_t idx = ((data->root_label == 0 && sys == arc_hybrid) ? 1 : 2);
  Search::predictor P(sch, (ptag)0);
  while (true)
  {
    if (sys == arc_hybrid && stack.size() <= 1 && idx > n)
      break;
    else if (sys == arc_eager && stack.size() == 0 && idx > n)
      break;
    bool computedFeatures = false;
    if (sch.predictNeedsExample())
    {
      extract_features(sch, idx, ec);
      computedFeatures = true;
    }
    get_valid_actions(sch, valid_actions, idx, n, (uint64_t)stack.size(), stack.empty() ? 0 : stack.last());
    if (sys == arc_hybrid)
      get_hybrid_action_cost(sch, idx, n);
    else if (sys == arc_eager)
      get_eager_action_cost(sch, idx, n);

    // get gold tag labels
    left_label = stack.empty() ? my_null : gold_tags[stack.last()];
    if (sys == arc_hybrid)
      right_label = stack.empty() ? my_null : gold_tags[stack.last()];
    else if (sys == arc_eager)
      right_label = idx <= n ? gold_tags[idx] : (uint32_t)data->root_label;
    else
      THROW("unknown transition system");

    uint32_t a_id = 0, t_id = 0;
    if (one_learner)
    {
      if (cost_to_go)
      {
        get_cost_to_go_losses(sch, gold_action_losses, left_label, right_label);
        a_id = P.set_tag((ptag)count)
                   .set_input(*(data->ex))
                   .set_allowed(gold_action_losses)
                   .set_condition_range(count - 1, sch.get_history_length(), 'p')
                   .set_learner_id(0)
                   .predict();
      }
      else
      {
        get_gold_actions(sch, idx, n, gold_actions);
        convert_to_onelearner_actions(sch, gold_actions, gold_action_temp, left_label, right_label);
        convert_to_onelearner_actions(sch, valid_actions, valid_action_temp, my_null, my_null);
        a_id = P.set_tag((ptag)count)
                   .set_input(*(data->ex))
                   .set_oracle(gold_action_temp)
                   .set_allowed(valid_action_temp)
                   .set_condition_range(count - 1, sch.get_history_length(), 'p')
                   .set_learner_id(0)
                   .predict();
      }
      if (a_id == SHIFT)
        t_id = 0;
      else if (a_id == 2 * num_label + 2)
      {
        t_id = 0;
        a_id = REDUCE;
      }
      else if (a_id > 1 && a_id - 1 <= num_label)
      {
        t_id = a_id - 1;
        a_id = REDUCE_RIGHT;
      }
      else
      {
        t_id = (uint64_t)a_id - num_label - 1;
        a_id = REDUCE_LEFT;
      }
    }
    else
    {
      if (cost_to_go)
      {
        get_cost_to_go_losses(sch, gold_action_losses, left_label, right_label);
        a_id = P.set_tag((ptag)count)
                   .set_input(*(data->ex))
                   .set_allowed(gold_action_losses)
                   .set_condition_range(count - 1, sch.get_history_length(), 'p')
                   .set_learner_id(0)
                   .predict();
      }
      else
      {
        get_gold_actions(sch, idx, n, gold_actions);
        a_id = P.set_tag((ptag)count)
                   .set_input(*(data->ex))
                   .set_oracle(gold_actions)
                   .set_allowed(valid_actions)
                   .set_condition_range(count - 1, sch.get_history_length(), 'p')
                   .set_learner_id(0)
                   .predict();
      }

      // Predict the next action {SHIFT, REDUCE_LEFT, REDUCE_RIGHT}
      count++;

      if (a_id != SHIFT && a_id != REDUCE)
      {
        if ((!computedFeatures) && sch.predictNeedsExample())
          extract_features(sch, idx, ec);

        if (cost_to_go)
        {
          gold_action_losses.clear();
          for (size_t i = 1; i <= data->num_label; i++)
            gold_action_losses.push_back(make_pair((action)i, i != (a_id == REDUCE_LEFT ? left_label : right_label)));
          t_id = P.set_tag((ptag)count)
                     .set_input(*(data->ex))
                     .set_allowed(gold_action_losses)
                     .set_condition_range(count - 1, sch.get_history_length(), 'p')
                     .set_learner_id(a_id - 1)
                     .predict();
        }
        else
        {
          t_id = P.set_tag((ptag)count)
                     .set_input(*(data->ex))
                     .set_oracle(a_id == REDUCE_LEFT ? left_label : right_label)
                     .erase_alloweds()
                     .set_condition_range(count - 1, sch.get_history_length(), 'p')
                     .set_learner_id(a_id - 1)
                     .predict();
        }
      }
    }
    count++;
    if (sys == arc_hybrid)
      idx = (uint32_t)transition_hybrid(sch, a_id, idx, t_id, n);
    else if (sys == arc_eager)
      idx = (uint32_t)transition_eager(sch, a_id, idx, t_id, n);
  }
  if (sys == arc_hybrid)
  {
    heads[stack.last()] = 0;
    tags[stack.last()] = (uint32_t)data->root_label;
    sch.loss((gold_heads[stack.last()] != heads[stack.last()]));
  }
  if (sch.output().good())
    for (size_t i = 1; i <= n; i++) sch.output() << (heads[i]) << ":" << tags[i] << endl;
}